

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

lyd_node * lyd_new_leaf(lyd_node *parent,lys_module *module,char *name,char *val_str)

{
  ly_ctx *ctx;
  int iVar1;
  lys_node *node;
  lys_node *parent_00;
  size_t sVar2;
  lyd_node *plVar3;
  lys_module *plVar4;
  lys_node *local_38;
  lys_node *snode;
  
  local_38 = (lys_node *)0x0;
  if (((parent != (lyd_node *)0x0 || module != (lys_module *)0x0) && name != (char *)0x0) &&
     (node = lyd_new_find_schema(parent,module,0), node != (lys_node *)0x0)) {
    parent_00 = lys_parent(node);
    sVar2 = strlen(name);
    iVar1 = lys_getnext_data(module,parent_00,name,(int)sVar2,LYS_LEAFLIST|LYS_LEAF,0,&local_38);
    if (iVar1 == 0 && local_38 != (lys_node *)0x0) {
      plVar3 = _lyd_new_leaf(parent,local_38,val_str,0,0);
      return plVar3;
    }
    ctx = node->module->ctx;
    plVar4 = lys_node_module(node);
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Failed to find \"%s\" as a sibling to \"%s:%s\".",name,
           plVar4->name,node->name);
    return (lyd_node *)0x0;
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_new_leaf");
  return (lyd_node *)0x0;
}

Assistant:

static struct lyd_node *
_lyd_new_leaf(struct lyd_node *parent, const struct lys_node *schema, const char *val_str, int dflt, int edit_leaf)
{
    struct lyd_node *ret;

    ret = lyd_create_leaf(schema, val_str, dflt);
    if (!ret) {
        return NULL;
    }

    /* connect to parent */
    if (parent) {
        if (lyd_insert(parent, ret)) {
            lyd_free(ret);
            return NULL;
        }
    }

    if (edit_leaf && !((struct lyd_node_leaf_list *)ret)->value_str[0]) {
        /* empty edit leaf, it is fine */
        ((struct lyd_node_leaf_list *)ret)->value_type = LY_TYPE_UNKNOWN;
        return ret;
    }

    /* resolve the type correctly (after it was connected to parent cause of log) */
    if (!lyp_parse_value(&((struct lys_node_leaf *)ret->schema)->type, &((struct lyd_node_leaf_list *)ret)->value_str,
                         NULL, (struct lyd_node_leaf_list *)ret, NULL, NULL, 1, dflt, 0)) {
        lyd_free(ret);
        return NULL;
    }

    if ((ret->schema->nodetype == LYS_LEAF) && (ret->schema->flags & LYS_UNIQUE)) {
        for (; parent && (parent->schema->nodetype != LYS_LIST); parent = parent->parent);
        if (parent) {
            parent->validity |= LYD_VAL_UNIQUE;
        } else {
            LOGINT(schema->module->ctx);
        }
    }

    return ret;
}